

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_compressSequences
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,ZSTD_Sequence *inSeqs,
                 size_t inSeqsSize,void *src,size_t srcSize)

{
  undefined1 uVar1;
  ZSTD_sequenceFormat_e ZVar2;
  ulong uVar3;
  ZSTD_compressedBlockState_t *pZVar4;
  ZSTD_compressedBlockState_t *pZVar5;
  short sVar6;
  int iVar7;
  size_t sVar8;
  size_t sVar9;
  code *pcVar10;
  ulong uVar11;
  size_t sVar12;
  XXH64_hash_t XVar13;
  code *pcVar14;
  ulong uVar15;
  undefined1 *__src;
  ulong uVar16;
  BYTE *op;
  size_t err_code;
  ulong uVar17;
  ulong local_c0;
  short *local_b0;
  undefined8 local_48;
  undefined8 uStack_40;
  
  sVar8 = ZSTD_CCtx_init_compressStream2(cctx,ZSTD_e_end,srcSize);
  if (sVar8 < 0xffffffffffffff89) {
    sVar9 = ZSTD_writeFrameHeader(dst,dstCapacity,&cctx->appliedParams,srcSize,cctx->dictID);
    if ((srcSize != 0) && ((cctx->appliedParams).fParams.checksumFlag != 0)) {
      XXH64_update(&cctx->xxhState,src,srcSize);
    }
    local_b0 = (short *)((long)dst + sVar9);
    uVar16 = dstCapacity - sVar9;
    local_48 = 0;
    uStack_40 = 0;
    ZVar2 = (cctx->appliedParams).blockDelimiters;
    pcVar14 = (code *)0x0;
    if (ZVar2 == ZSTD_sf_noBlockDelimiters) {
      pcVar14 = ZSTD_copySequencesToSeqStoreNoBlockDelim;
    }
    pcVar10 = ZSTD_copySequencesToSeqStoreExplicitBlockDelim;
    if (ZVar2 != ZSTD_sf_explicitBlockDelimiters) {
      pcVar10 = pcVar14;
    }
    if (srcSize == 0) {
      if (uVar16 < 4) {
        return 0xffffffffffffffba;
      }
      local_b0[0] = 1;
      local_b0[1] = 0;
      uVar15 = 3;
    }
    else {
      uVar15 = 0;
      sVar8 = srcSize;
      __src = (undefined1 *)src;
      local_c0 = uVar16;
      do {
        uVar3 = cctx->blockSize;
        uVar17 = uVar3;
        if (sVar8 < uVar3) {
          uVar17 = sVar8;
        }
        (cctx->seqStore).lit = (cctx->seqStore).litStart;
        (cctx->seqStore).sequences = (cctx->seqStore).sequencesStart;
        (cctx->seqStore).longLengthType = ZSTD_llt_none;
        iVar7 = 0x5ecde5;
        uVar11 = (*pcVar10)(cctx,&local_48,inSeqs,inSeqsSize,__src,uVar17 & 0xffffffff);
        if (0xffffffffffffff88 < uVar11) {
          return uVar11;
        }
        uVar11 = (uVar17 & 0xffffffff) - uVar11;
        sVar6 = (short)uVar11;
        if (uVar11 < 7) {
          uVar17 = uVar11 + 3;
          if (local_c0 < uVar17) {
            return 0xffffffffffffffba;
          }
          *local_b0 = (ushort)(sVar8 <= uVar3) + sVar6 * 8;
          *(undefined1 *)(local_b0 + 1) = 0;
          memcpy((void *)((long)local_b0 + 3),__src,uVar11);
          uVar15 = uVar15 + uVar17;
        }
        else {
          sVar12 = ZSTD_entropyCompressSeqStore
                             (&cctx->seqStore,&((cctx->blockState).prevCBlock)->entropy,
                              &((cctx->blockState).nextCBlock)->entropy,&cctx->appliedParams,
                              (void *)((long)local_b0 + 3),local_c0 - 3,uVar11,
                              cctx->entropyWorkspace,(ulong)(uint)cctx->bmi2,iVar7);
          if (0xffffffffffffff88 < sVar12) {
            return sVar12;
          }
          if (((((cctx->isFirstBlock == 0) &&
                ((ulong)((long)(cctx->seqStore).sequences - (long)(cctx->seqStore).sequencesStart) <
                 0x20)) &&
               ((ulong)((long)(cctx->seqStore).lit - (long)(cctx->seqStore).litStart) < 10)) &&
              (iVar7 = ZSTD_isRLE((BYTE *)src,srcSize), iVar7 != 0)) || (sVar12 == 1)) {
            if (local_c0 < 4) {
              return 0xffffffffffffffba;
            }
            uVar1 = *__src;
            *local_b0 = (ushort)(sVar8 <= uVar3) + sVar6 * 8 + 2;
            *(char *)(local_b0 + 1) = (char)(uVar11 >> 0xd);
            *(undefined1 *)((long)local_b0 + 3) = uVar1;
            uVar17 = 4;
          }
          else if (sVar12 == 0) {
            uVar17 = uVar11 + 3;
            if (local_c0 < uVar17) {
              return 0xffffffffffffffba;
            }
            *local_b0 = (ushort)(sVar8 <= uVar3) + sVar6 * 8;
            *(char *)(local_b0 + 1) = (char)(uVar11 >> 0xd);
            memcpy((void *)((long)local_b0 + 3),__src,uVar11);
            if (0xffffffffffffff88 < uVar17) {
              return uVar17;
            }
          }
          else {
            pZVar4 = (cctx->blockState).prevCBlock;
            pZVar5 = (cctx->blockState).nextCBlock;
            (cctx->blockState).prevCBlock = pZVar5;
            (cctx->blockState).nextCBlock = pZVar4;
            if ((pZVar5->entropy).fse.offcode_repeatMode == FSE_repeat_valid) {
              (pZVar5->entropy).fse.offcode_repeatMode = FSE_repeat_check;
            }
            *local_b0 = (ushort)(sVar8 <= uVar3) + (short)sVar12 * 8 + 4;
            *(char *)(local_b0 + 1) = (char)(sVar12 >> 0xd);
            uVar17 = sVar12 + 3;
          }
          uVar15 = uVar15 + uVar17;
          if (sVar8 <= uVar3) break;
          cctx->isFirstBlock = 0;
        }
        local_c0 = local_c0 - uVar17;
        __src = __src + uVar11;
        local_b0 = (short *)((long)local_b0 + uVar17);
        sVar8 = sVar8 - uVar11;
      } while (sVar8 != 0);
      if (0xffffffffffffff88 < uVar15) {
        return uVar15;
      }
    }
    sVar9 = sVar9 + uVar15;
    sVar8 = sVar9;
    if ((cctx->appliedParams).fParams.checksumFlag != 0) {
      XVar13 = XXH64_digest(&cctx->xxhState);
      sVar8 = 0xffffffffffffffba;
      if (3 < uVar16 - uVar15) {
        *(int *)((long)dst + sVar9) = (int)XVar13;
        sVar8 = sVar9 + 4;
      }
    }
  }
  return sVar8;
}

Assistant:

size_t ZSTD_compressSequences(ZSTD_CCtx* const cctx, void* dst, size_t dstCapacity,
                              const ZSTD_Sequence* inSeqs, size_t inSeqsSize,
                              const void* src, size_t srcSize) {
    BYTE* op = (BYTE*)dst;
    size_t cSize = 0;
    size_t compressedBlocksSize = 0;
    size_t frameHeaderSize = 0;

    /* Transparent initialization stage, same as compressStream2() */
    DEBUGLOG(3, "ZSTD_compressSequences()");
    assert(cctx != NULL);
    FORWARD_IF_ERROR(ZSTD_CCtx_init_compressStream2(cctx, ZSTD_e_end, srcSize), "CCtx initialization failed");
    /* Begin writing output, starting with frame header */
    frameHeaderSize = ZSTD_writeFrameHeader(op, dstCapacity, &cctx->appliedParams, srcSize, cctx->dictID);
    op += frameHeaderSize;
    dstCapacity -= frameHeaderSize;
    cSize += frameHeaderSize;
    if (cctx->appliedParams.fParams.checksumFlag && srcSize) {
        XXH64_update(&cctx->xxhState, src, srcSize);
    }
    /* cSize includes block header size and compressed sequences size */
    compressedBlocksSize = ZSTD_compressSequences_internal(cctx,
                                                           op, dstCapacity,
                                                           inSeqs, inSeqsSize,
                                                           src, srcSize);
    FORWARD_IF_ERROR(compressedBlocksSize, "Compressing blocks failed!");
    cSize += compressedBlocksSize;
    dstCapacity -= compressedBlocksSize;

    if (cctx->appliedParams.fParams.checksumFlag) {
        U32 const checksum = (U32) XXH64_digest(&cctx->xxhState);
        RETURN_ERROR_IF(dstCapacity<4, dstSize_tooSmall, "no room for checksum");
        DEBUGLOG(4, "Write checksum : %08X", (unsigned)checksum);
        MEM_writeLE32((char*)dst + cSize, checksum);
        cSize += 4;
    }

    DEBUGLOG(3, "Final compressed size: %zu", cSize);
    return cSize;
}